

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_from_string__large(void)

{
  _Bool _Var1;
  undefined1 local_58 [8];
  bson_decimal128_t full_house;
  bson_decimal128_t tiniest;
  bson_decimal128_t largest;
  bson_decimal128_t all_digits;
  bson_decimal128_t large;
  
  bson_decimal128_from_string("12345689012345789012345",&all_digits.high);
  bson_decimal128_from_string("1234567890123456789012345678901234",&largest.high);
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&tiniest.high);
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&full_house.high);
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",local_58);
  _Var1 = decimal128_equal((bson_decimal128_t *)&all_digits.high,0x304000000000029d,
                           0x42da3a76f9e0d979);
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x1d5,"test_decimal128_from_string__large",
            "decimal128_equal (&large, 0x304000000000029d, 0x42da3a76f9e0d979)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)&largest.high,0x30403cde6fff9732,0xde825cd07e96aff2)
  ;
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x1d7,"test_decimal128_from_string__large",
            "decimal128_equal (&all_digits, 0x30403cde6fff9732, 0xde825cd07e96aff2)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)&tiniest.high,0x5fffed09bead87c0,0x378d8e63ffffffff)
  ;
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x1d8,"test_decimal128_from_string__large",
            "decimal128_equal (&largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)&full_house.high,0x1ed09bead87c0,0x378d8e63ffffffff)
  ;
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x1d9,"test_decimal128_from_string__large",
            "decimal128_equal (&tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)local_58,0x3040ffffffffffff,0xffffffffffffffff);
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x1db,"test_decimal128_from_string__large",
            "decimal128_equal (&full_house, 0x3040ffffffffffff, 0xffffffffffffffff)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_from_string__large (void)
{
   bson_decimal128_t large;
   bson_decimal128_t all_digits;
   bson_decimal128_t largest;
   bson_decimal128_t tiniest;
   bson_decimal128_t full_house;

   bson_decimal128_from_string ("12345689012345789012345", &large);
   bson_decimal128_from_string ("1234567890123456789012345678901234",
                                &all_digits);
   bson_decimal128_from_string ("9.999999999999999999999999999999999E+6144",
                                &largest);
   bson_decimal128_from_string ("9.999999999999999999999999999999999E-6143",
                                &tiniest);
   bson_decimal128_from_string ("5.192296858534827628530496329220095E+33",
                                &full_house);

   BSON_ASSERT (decimal128_equal (&large, 0x304000000000029d, 0x42da3a76f9e0d979));
   BSON_ASSERT (
      decimal128_equal (&all_digits, 0x30403cde6fff9732, 0xde825cd07e96aff2));
   BSON_ASSERT (decimal128_equal (&largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff));
   BSON_ASSERT (decimal128_equal (&tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff));
   BSON_ASSERT (
      decimal128_equal (&full_house, 0x3040ffffffffffff, 0xffffffffffffffff));
}